

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_visitor<char>::bool_value
          (basic_json_visitor<char> *this,bool value,semantic_tag tag,ser_context *context)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  long *in_RCX;
  undefined1 in_DL;
  byte in_SIL;
  long *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar6;
  
  std::error_code::error_code(in_stack_ffffffffffffffa0);
  (**(code **)(*in_RDI + 0x58))(in_RDI,in_SIL & 1,in_DL,in_RCX,&stack0xffffffffffffffd8);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    return true;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  iVar3 = in_stack_ffffffffffffffd8;
  uVar4 = in_stack_ffffffffffffffdc;
  uVar5 = in_stack_ffffffffffffffe0;
  uVar6 = in_stack_ffffffffffffffe4;
  (**(code **)(*in_RCX + 0x10))();
  (**(code **)(*in_RCX + 0x18))();
  ec_00._4_4_ = uVar4;
  ec_00._M_value = iVar3;
  ec_00._M_cat._0_4_ = uVar5;
  ec_00._M_cat._4_4_ = uVar6;
  ser_error::ser_error
            ((ser_error *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),ec_00,
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffc0
            );
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE bool_value(bool value, 
            semantic_tag tag = semantic_tag::none,
            const ser_context& context=ser_context()) 
        {
            std::error_code ec;
            visit_bool(value, tag, context, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, context.line(), context.column()));
            }
            JSONCONS_VISITOR_RETURN;
        }